

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImDrawList *draw_list,ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,
               ImVec2 grid_off,float rounding,int rounding_corners_flags)

{
  ImU32 IVar1;
  ImU32 IVar2;
  uint uVar3;
  byte bVar4;
  float fVar5;
  float fVar6;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 local_b8;
  ImVec2 local_b0;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  ImVec2 local_98;
  ImVec2 local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_b8 = p_max;
  local_b0 = p_min;
  if (col < 0xff000000) {
    local_88._8_4_ = in_XMM3_Dc;
    local_88._0_8_ = grid_off;
    local_88._12_4_ = in_XMM3_Dd;
    IVar1 = ImAlphaBlendColors(0xffcccccc,col);
    IVar1 = GetColorU32(IVar1);
    IVar2 = ImAlphaBlendColors(0xff808080,col);
    IVar2 = GetColorU32(IVar2);
    ImDrawList::AddRectFilled(draw_list,&local_b0,&local_b8,IVar1,rounding,rounding_corners_flags);
    local_78 = ZEXT416((uint)local_b0.y);
    local_68 = (float)local_88._4_4_ + local_b0.y;
    if (local_68 < local_b8.y) {
      fVar6 = (float)local_88._0_4_ + local_b0.x;
      bVar4 = 0;
      local_88._0_4_ = fVar6;
      local_a4 = local_b8.y;
      local_58 = ZEXT416((uint)local_b0.x);
      local_a8 = local_b8.x;
      fStack_64 = (float)local_88._4_4_;
      fStack_60 = (float)local_88._4_4_;
      fStack_5c = (float)local_88._4_4_;
      fVar7 = local_b8.y;
      fVar8 = local_b0.x;
      fVar9 = local_b8.x;
      do {
        fVar5 = fVar7;
        if (local_68 <= fVar7) {
          fVar5 = local_68;
        }
        uStack_44 = (uint)fStack_64 & local_78._4_4_;
        uStack_40 = (uint)fStack_60 & local_78._8_4_;
        uStack_3c = (uint)fStack_5c & local_78._12_4_;
        local_90.y = (float)(-(uint)(local_68 < (float)local_78._0_4_) & local_78._0_4_ |
                            ~-(uint)(local_68 < (float)local_78._0_4_) & (uint)fVar5);
        local_68 = local_68 + grid_step;
        local_98.y = local_68;
        if (fVar7 <= local_68) {
          local_98.y = fVar7;
        }
        if ((local_90.y < local_98.y) &&
           (local_9c = (float)bVar4 * grid_step + fVar6, local_a0 = local_98.y,
           local_48 = local_90.y, local_9c < fVar9)) {
          do {
            fVar5 = fVar9;
            if (local_9c <= fVar9) {
              fVar5 = local_9c;
            }
            local_90.x = (float)(-(uint)(local_9c < fVar8) & (uint)fVar8 |
                                ~-(uint)(local_9c < fVar8) & (uint)fVar5);
            local_98.x = local_9c + grid_step;
            if (fVar9 <= local_9c + grid_step) {
              local_98.x = fVar9;
            }
            if (local_90.x < local_98.x) {
              uVar3 = 0;
              if (local_90.y <= (float)local_78._0_4_) {
                uVar3 = (uint)(local_90.x <= fVar8);
                if (fVar9 <= local_98.x) {
                  uVar3 = local_90.x <= fVar8 | 2;
                }
              }
              if (fVar7 <= local_98.y) {
                if (local_90.x <= fVar8) {
                  uVar3 = uVar3 + 4;
                }
                if (fVar9 <= local_98.x) {
                  uVar3 = uVar3 | 8;
                }
              }
              fVar6 = 0.0;
              if ((uVar3 & rounding_corners_flags) != 0) {
                fVar6 = rounding;
              }
              ImDrawList::AddRectFilled
                        (draw_list,&local_90,&local_98,IVar2,fVar6,uVar3 & rounding_corners_flags);
              fVar6 = (float)local_88._0_4_;
              local_98.y = local_a0;
              fVar7 = local_a4;
              fVar8 = (float)local_58._0_4_;
              fVar9 = local_a8;
              local_90.y = local_48;
            }
            local_9c = local_9c + grid_step + grid_step;
          } while (local_9c < fVar9);
        }
        bVar4 = bVar4 ^ 1;
      } while (local_68 < fVar7);
    }
  }
  else {
    ImDrawList::AddRectFilled(draw_list,&local_b0,&local_b8,col,rounding,rounding_corners_flags);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImDrawList* draw_list, ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, int rounding_corners_flags)
{
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = ImGui::GetColorU32(ImAlphaBlendColors(IM_COL32(204, 204, 204, 255), col));
        ImU32 col_bg2 = ImGui::GetColorU32(ImAlphaBlendColors(IM_COL32(128, 128, 128, 255), col));
        draw_list->AddRectFilled(p_min, p_max, col_bg1, rounding, rounding_corners_flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                int rounding_corners_flags_cell = 0;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotRight; }
                rounding_corners_flags_cell &= rounding_corners_flags;
                draw_list->AddRectFilled(ImVec2(x1, y1), ImVec2(x2, y2), col_bg2, rounding_corners_flags_cell ? rounding : 0.0f, rounding_corners_flags_cell);
            }
        }
    }
    else
    {
        draw_list->AddRectFilled(p_min, p_max, col, rounding, rounding_corners_flags);
    }
}